

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

pair<std::error_code,_std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>_>
* __thiscall
ylt::metric::dynamic_metric_manager<test_id_t<1ul>>::
create_metric_dynamic<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>,std::array<std::__cxx11::string,2ul>>
          (dynamic_metric_manager<test_id_t<1UL>_> *this,string *name,string *help,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          *args)

{
  byte bVar1;
  pair<std::error_code,_std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>_>
  *in_RDI;
  bool r;
  shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_> m;
  pair<std::error_code,_std::nullptr_t> *in_stack_ffffffffffffff18;
  pair<std::error_code,_std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>_>
  *in_stack_ffffffffffffff20;
  error_code *this_00;
  pair<std::error_code,_std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_>_>
  *__x;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_stack_ffffffffffffff48;
  shared_ptr<ylt::metric::dynamic_metric> *metric;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  shared_ptr<ylt::metric::dynamic_metric> local_50;
  byte local_39;
  
  __x = in_RDI;
  std::
  make_shared<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::array<std::__cxx11::string,2ul>>
            (in_stack_ffffffffffffff58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  metric = &local_50;
  std::shared_ptr<ylt::metric::dynamic_metric>::
  shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>,void>
            ((shared_ptr<ylt::metric::dynamic_metric> *)in_stack_ffffffffffffff20,
             (shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_> *)
             in_stack_ffffffffffffff18);
  bVar1 = dynamic_metric_manager<test_id_t<1UL>_>::register_metric
                    ((dynamic_metric_manager<test_id_t<1UL>_> *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),metric);
  std::shared_ptr<ylt::metric::dynamic_metric>::~shared_ptr
            ((shared_ptr<ylt::metric::dynamic_metric> *)0x2429fc);
  local_39 = bVar1 & 1;
  if (local_39 == 0) {
    std::make_error_code(0);
    std::make_pair<std::error_code,decltype(nullptr)>
              (&in_stack_ffffffffffffff20->first,(void **)in_stack_ffffffffffffff18);
    std::
    pair<std::error_code,_std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>_>_>
    ::pair<std::error_code,_std::nullptr_t,_true>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else {
    this_00 = (error_code *)&stack0xffffffffffffff58;
    std::error_code::error_code(this_00);
    std::
    make_pair<std::error_code,std::shared_ptr<ylt::metric::basic_dynamic_counter<long,(unsigned_char)2>>&>
              (&__x->first,
               (shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_> *)
               this_00);
  }
  std::shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>_>::~shared_ptr
            ((shared_ptr<ylt::metric::basic_dynamic_counter<long,_(unsigned_char)__x02_>_> *)
             0x242ada);
  return in_RDI;
}

Assistant:

std::pair<std::error_code, std::shared_ptr<T>> create_metric_dynamic(
      const std::string& name, const std::string& help, Args&&... args) {
    auto m = std::make_shared<T>(name, help, std::forward<Args>(args)...);
    bool r = register_metric(m);
    if (!r) {
      return std::make_pair(std::make_error_code(std::errc::invalid_argument),
                            nullptr);
    }

    return std::make_pair(std::error_code{}, m);
  }